

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::CopyResourceSignatures
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,PipelineStateCreateInfo *CreateInfo
          ,FixedLinearAllocator *MemPool)

{
  PipelineResourceSignatureDesc *Args;
  byte bVar1;
  PipelineResourceSignatureVkImpl *pObj;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  SHADER_TYPE SVar5;
  SignatureAutoPtrType *__s;
  char (*in_RCX) [86];
  Uint32 StageIndex;
  ulong uVar6;
  ulong uVar7;
  string msg;
  Char *local_60;
  uint local_54;
  PipelineStateBase<Diligent::EngineVkImplTraits> *local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  bVar1 = this->m_SignatureCount;
  uVar7 = (ulong)((uint)bVar1 * 8);
  __s = (SignatureAutoPtrType *)FixedLinearAllocator::Allocate(MemPool,uVar7,8);
  if (bVar1 != 0) {
    memset(__s,0,uVar7);
  }
  this->m_Signatures = __s;
  if ((this->m_UsingImplicitSignature != true) ||
     (((byte *)CreateInfo->pInternalData != (byte *)0x0 && ((*CreateInfo->pInternalData & 1) != 0)))
     ) {
    if ((CreateInfo->ResourceSignaturesCount == 0) ||
       (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
      FormatString<char[26],char[86]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures != nullptr"
                 ,in_RCX);
      in_RCX = (char (*) [86])0x4fb;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CopyResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4fb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if (CreateInfo->ResourceSignaturesCount != 0) {
      uVar7 = 0;
      local_50 = this;
      do {
        pObj = (PipelineResourceSignatureVkImpl *)CreateInfo->ppResourceSignatures[uVar7];
        if (pObj == (PipelineResourceSignatureVkImpl *)0x0) {
          FormatString<char[26],char[22]>
                    (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x807e6d,
                     (char (*) [22])in_RCX);
          in_RCX = (char (*) [86])0x4ff;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CopyResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x4ff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          CheckDynamicType<Diligent::PipelineResourceSignatureVkImpl,Diligent::IPipelineResourceSignature>
                    ((IPipelineResourceSignature *)pObj);
        }
        bVar1 = (pObj->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc.BindingIndex;
        uVar3 = (uint)bVar1;
        if (this->m_SignatureCount <= bVar1) {
          FormatString<char[26],char[25]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"Index < m_SignatureCount",(char (*) [25])in_RCX);
          in_RCX = (char (*) [86])0x504;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CopyResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x504);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        Args = &(pObj->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc;
        uVar6 = (ulong)uVar3;
        local_40 = uVar7;
        if (this->m_Signatures[uVar6].m_pObject != (PipelineResourceSignatureVkImpl *)0x0) {
          local_60 = (Char *)CONCAT44(local_60._4_4_,uVar3);
          FormatString<char[30],char_const*,char[12],unsigned_int,char[45],char_const*,char[100]>
                    (&msg,(Diligent *)"Pipeline resource signature \'",(char (*) [30])Args,
                     (char **)"\' at index ",(char (*) [12])&local_60,
                     (uint *)" conflicts with another resource signature \'",
                     (char (*) [45])
                     &((this->m_Signatures[uVar6].m_pObject)->
                      super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      .m_Desc,(char **)
                              "\' that uses the same index. This error should\'ve been caught by ValidatePipelineResourceSignatures."
                     ,(char (*) [100])msg._M_dataplus._M_p);
          in_RCX = (char (*) [86])0x509;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CopyResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x509);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        SVar5 = (pObj->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                m_ShaderStages;
        local_48 = uVar6;
        if (SVar5 != SHADER_TYPE_UNKNOWN) {
          uVar4 = SVar5 - (SVar5 >> 1 & 0x55555555);
          uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
          uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f;
          in_RCX = (char (*) [86])(ulong)uVar4;
          uVar4 = uVar4 * 0x1010101 >> 0x18;
          StageIndex = 0;
          do {
            SVar5 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
                    GetActiveShaderStageType
                              ((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)pObj,
                               StageIndex);
            bVar2 = IsConsistentShaderType(SVar5,(CreateInfo->PSODesc).PipelineType);
            if (!bVar2) {
              local_54 = uVar3;
              local_60 = GetShaderTypeLiteralName(SVar5);
              local_38 = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
              FormatString<char[30],char_const*,char[12],unsigned_int,char[20],char_const*,char[46],char_const*,char[3]>
                        (&msg,(Diligent *)"Pipeline resource signature \'",(char (*) [30])Args,
                         (char **)"\' at index ",(char (*) [12])&local_54,
                         (uint *)" has shader stage \'",(char (*) [20])&local_60,
                         (char **)"\' that is not compatible with pipeline type \'",
                         (char (*) [46])&local_38,(char **)"\'.",(char (*) [3])msg._M_dataplus._M_p)
              ;
              in_RCX = (char (*) [86])0x511;
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"CopyResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                         ,0x511);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
            StageIndex = StageIndex + 1;
          } while (uVar4 + (uVar4 == 0) != StageIndex);
        }
        this = local_50;
        RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator=
                  ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                   ((long)&local_50->m_Signatures->m_pObject + (ulong)(uint)((int)local_48 << 3)),
                   pObj);
        uVar7 = local_40 + 1;
      } while (uVar7 < CreateInfo->ResourceSignaturesCount);
    }
  }
  return;
}

Assistant:

void CopyResourceSignatures(const PipelineStateCreateInfo& CreateInfo, FixedLinearAllocator& MemPool)
    {
        m_Signatures = MemPool.ConstructArray<SignatureAutoPtrType>(m_SignatureCount);
        if (!m_UsingImplicitSignature || (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0)
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures != nullptr);
            for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
            {
                PipelineResourceSignatureImplType* pSignature = ClassPtrCast<PipelineResourceSignatureImplType>(CreateInfo.ppResourceSignatures[i]);
                VERIFY_EXPR(pSignature != nullptr);

                const Uint32 Index = pSignature->GetDesc().BindingIndex;

#ifdef DILIGENT_DEBUG
                VERIFY_EXPR(Index < m_SignatureCount);

                VERIFY(m_Signatures[Index] == nullptr,
                       "Pipeline resource signature '", pSignature->GetDesc().Name, "' at index ", Uint32{Index},
                       " conflicts with another resource signature '", m_Signatures[Index]->GetDesc().Name,
                       "' that uses the same index. This error should've been caught by ValidatePipelineResourceSignatures.");

                for (Uint32 s = 0, StageCount = pSignature->GetNumActiveShaderStages(); s < StageCount; ++s)
                {
                    const SHADER_TYPE ShaderType = pSignature->GetActiveShaderStageType(s);
                    VERIFY(IsConsistentShaderType(ShaderType, CreateInfo.PSODesc.PipelineType),
                           "Pipeline resource signature '", pSignature->GetDesc().Name, "' at index ", Uint32{Index},
                           " has shader stage '", GetShaderTypeLiteralName(ShaderType), "' that is not compatible with pipeline type '",
                           GetPipelineTypeString(CreateInfo.PSODesc.PipelineType), "'.");
                }
#endif

                m_Signatures[Index] = pSignature;
            }
        }
    }